

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O0

string * __thiscall FIX::HttpMessage::toString(HttpMessage *this,string *str)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *str_local;
  HttpMessage *this_local;
  
  local_18 = str;
  str_local = &this->m_root;
  getParameterString_abi_cxx11_(&local_58,this);
  std::operator+(&local_38,&this->m_root,&local_58);
  std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return local_18;
}

Assistant:

std::string &HttpMessage::toString(std::string &str) const {
  str = m_root + getParameterString();
  return str;
}